

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

wchar_t lookup_feat_code(char *code)

{
  int iVar1;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = feat_code_list;
  lVar2 = 0;
  do {
    iVar1 = strcmp(code,*ppcVar3);
    if (iVar1 == 0) goto LAB_0012c763;
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (lVar2 != 0x19);
  lVar2 = 0xffffffff;
LAB_0012c763:
  return (wchar_t)lVar2;
}

Assistant:

int lookup_feat_code(const char *code)
{
	int i = 0;

	while (1) {
		assert(i >= 0 && i < (int) N_ELEMENTS(feat_code_list));
		if (!feat_code_list[i]) {
			return -1;
		}
		if (streq(code, feat_code_list[i])) {
			break;
		}
		++i;
	}
	return i;
}